

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool __thiscall TestRuns::Run(TestRuns *this)

{
  bool bVar1;
  reference pvVar2;
  RunParams local_3fb8;
  allocator local_3f91;
  string local_3f90 [32];
  undefined1 local_3f70 [8];
  Results rs_2;
  string local_3f50 [39];
  allocator local_3f29;
  string local_3f28 [32];
  undefined1 local_3f08 [8];
  TestRunsInternal myTestA_2;
  TestRegistry r_2;
  allocator local_2a59;
  string local_2a58 [32];
  undefined1 local_2a38 [8];
  Results rs_1;
  string local_2a18 [39];
  allocator local_29f1;
  string local_29f0 [32];
  undefined1 local_29d0 [8];
  TestRunsInternal myTestA_1;
  TestRegistry r_1;
  RunParams local_1538;
  undefined1 local_1520 [8];
  Results rs;
  string local_1500 [55];
  allocator local_14c9;
  string local_14c8 [32];
  undefined1 local_14a8 [8];
  TestRunsInternal myTestA;
  TestRegistry r;
  TestRuns *this_local;
  
  testinator::TestRegistry::TestRegistry((TestRegistry *)&myTestA.super_Test.m_op);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_14c8,"A",&local_14c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1500,"B",
             (allocator *)
             ((long)&rs.super__Vector_base<testinator::Result,_std::allocator<testinator::Result>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  TestRunsInternal::TestRunsInternal
            ((TestRunsInternal *)local_14a8,(TestRegistry *)&myTestA.super_Test.m_op,
             (string *)local_14c8,(string *)local_1500);
  std::__cxx11::string::~string(local_1500);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&rs.super__Vector_base<testinator::Result,_std::allocator<testinator::Result>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::__cxx11::string::~string(local_14c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_14c9);
  local_1538.m_flags = 0;
  local_1538._4_4_ = 0;
  local_1538.m_numPropertyChecks = 0;
  local_1538.m_randomSeed = 0;
  testinator::RunParams::RunParams(&local_1538);
  testinator::TestRegistry::RunAllTests
            ((Results *)local_1520,(TestRegistry *)&myTestA.super_Test.m_op,&local_1538,
             (Outputter *)0x0);
  bVar1 = std::vector<testinator::Result,_std::allocator<testinator::Result>_>::empty
                    ((vector<testinator::Result,_std::allocator<testinator::Result>_> *)local_1520);
  if ((bVar1) ||
     (pvVar2 = std::vector<testinator::Result,_std::allocator<testinator::Result>_>::front
                         ((vector<testinator::Result,_std::allocator<testinator::Result>_> *)
                          local_1520), (pvVar2->m_success & 1U) == 0)) {
    this_local._7_1_ = 0;
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  std::vector<testinator::Result,_std::allocator<testinator::Result>_>::~vector
            ((vector<testinator::Result,_std::allocator<testinator::Result>_> *)local_1520);
  TestRunsInternal::~TestRunsInternal((TestRunsInternal *)local_14a8);
  testinator::TestRegistry::~TestRegistry((TestRegistry *)&myTestA.super_Test.m_op);
  if (!bVar1) {
    testinator::TestRegistry::TestRegistry((TestRegistry *)&myTestA_1.super_Test.m_op);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_29f0,"A",&local_29f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_2a18,"B",
               (allocator *)
               ((long)&rs_1.
                       super__Vector_base<testinator::Result,_std::allocator<testinator::Result>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    TestRunsInternal::TestRunsInternal
              ((TestRunsInternal *)local_29d0,(TestRegistry *)&myTestA_1.super_Test.m_op,
               (string *)local_29f0,(string *)local_2a18);
    std::__cxx11::string::~string(local_2a18);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&rs_1.
                       super__Vector_base<testinator::Result,_std::allocator<testinator::Result>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::__cxx11::string::~string(local_29f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_29f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2a58,"A",&local_2a59);
    r_2.m_abort = false;
    r_2._5193_7_ = 0;
    testinator::RunParams::RunParams((RunParams *)&r_2.m_abort);
    testinator::TestRegistry::RunTest
              ((Results *)local_2a38,(TestRegistry *)&myTestA_1.super_Test.m_op,(string *)local_2a58
               ,(RunParams *)&r_2.m_abort,(Outputter *)0x0);
    std::__cxx11::string::~string(local_2a58);
    std::allocator<char>::~allocator((allocator<char> *)&local_2a59);
    bVar1 = std::vector<testinator::Result,_std::allocator<testinator::Result>_>::empty
                      ((vector<testinator::Result,_std::allocator<testinator::Result>_> *)local_2a38
                      );
    if ((bVar1) ||
       (pvVar2 = std::vector<testinator::Result,_std::allocator<testinator::Result>_>::front
                           ((vector<testinator::Result,_std::allocator<testinator::Result>_> *)
                            local_2a38), (pvVar2->m_success & 1U) == 0)) {
      this_local._7_1_ = 0;
      bVar1 = true;
    }
    else {
      bVar1 = false;
    }
    std::vector<testinator::Result,_std::allocator<testinator::Result>_>::~vector
              ((vector<testinator::Result,_std::allocator<testinator::Result>_> *)local_2a38);
    TestRunsInternal::~TestRunsInternal((TestRunsInternal *)local_29d0);
    testinator::TestRegistry::~TestRegistry((TestRegistry *)&myTestA_1.super_Test.m_op);
    if (!bVar1) {
      testinator::TestRegistry::TestRegistry((TestRegistry *)&myTestA_2.super_Test.m_op);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3f28,"A",&local_3f29);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_3f50,"B",
                 (allocator *)
                 ((long)&rs_2.
                         super__Vector_base<testinator::Result,_std::allocator<testinator::Result>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      TestRunsInternal::TestRunsInternal
                ((TestRunsInternal *)local_3f08,(TestRegistry *)&myTestA_2.super_Test.m_op,
                 (string *)local_3f28,(string *)local_3f50);
      std::__cxx11::string::~string(local_3f50);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&rs_2.
                         super__Vector_base<testinator::Result,_std::allocator<testinator::Result>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      std::__cxx11::string::~string(local_3f28);
      std::allocator<char>::~allocator((allocator<char> *)&local_3f29);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_3f90,"B",&local_3f91);
      local_3fb8.m_flags = 0;
      local_3fb8._4_4_ = 0;
      local_3fb8.m_numPropertyChecks = 0;
      local_3fb8.m_randomSeed = 0;
      testinator::RunParams::RunParams(&local_3fb8);
      testinator::TestRegistry::RunSuite
                ((Results *)local_3f70,(TestRegistry *)&myTestA_2.super_Test.m_op,
                 (string *)local_3f90,&local_3fb8,(Outputter *)0x0);
      std::__cxx11::string::~string(local_3f90);
      std::allocator<char>::~allocator((allocator<char> *)&local_3f91);
      bVar1 = std::vector<testinator::Result,_std::allocator<testinator::Result>_>::empty
                        ((vector<testinator::Result,_std::allocator<testinator::Result>_> *)
                         local_3f70);
      if ((bVar1) ||
         (pvVar2 = std::vector<testinator::Result,_std::allocator<testinator::Result>_>::front
                             ((vector<testinator::Result,_std::allocator<testinator::Result>_> *)
                              local_3f70), (pvVar2->m_success & 1U) == 0)) {
        this_local._7_1_ = 0;
        bVar1 = true;
      }
      else {
        bVar1 = false;
      }
      std::vector<testinator::Result,_std::allocator<testinator::Result>_>::~vector
                ((vector<testinator::Result,_std::allocator<testinator::Result>_> *)local_3f70);
      TestRunsInternal::~TestRunsInternal((TestRunsInternal *)local_3f08);
      testinator::TestRegistry::~TestRegistry((TestRegistry *)&myTestA_2.super_Test.m_op);
      if (!bVar1) {
        this_local._7_1_ = 1;
      }
    }
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

virtual bool Run()
  {
    {
      testinator::TestRegistry r;
      TestRunsInternal myTestA(r, "A", "B");
      testinator::Results rs = r.RunAllTests();
      if (rs.empty() || !rs.front().m_success)
        return false;
    }
    {
      testinator::TestRegistry r;
      TestRunsInternal myTestA(r, "A", "B");
      testinator::Results rs = r.RunTest("A");
      if (rs.empty() || !rs.front().m_success)
        return false;
    }
    {
      testinator::TestRegistry r;
      TestRunsInternal myTestA(r, "A", "B");
      testinator::Results rs = r.RunSuite("B");
      if (rs.empty() || !rs.front().m_success)
        return false;
    }
    return true;
  }